

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall fmt::v6::detail::bigint::multiply(bigint *this,uint64_t value)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = (this->bigits_).super_buffer<unsigned_int>.size_;
  if (uVar2 != 0) {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar6 = 0;
    uVar3 = 0;
    do {
      uVar4 = (ulong)puVar1[uVar3];
      uVar5 = (uVar6 & 0xffffffff) + (value & 0xffffffff) * uVar4;
      puVar1[uVar3] = (uint)uVar5;
      uVar6 = (uVar6 >> 0x20) + uVar4 * (value >> 0x20) + (uVar5 >> 0x20);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
    for (; uVar6 != 0; uVar6 = uVar6 >> 0x20) {
      uVar3 = uVar2 + 1;
      if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar3) {
        (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
        uVar2 = (this->bigits_).super_buffer<unsigned_int>.size_;
        uVar3 = uVar2 + 1;
      }
      puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      (this->bigits_).super_buffer<unsigned_int>.size_ = uVar3;
      puVar1[uVar2] = (uint)uVar6;
      uVar2 = uVar3;
    }
  }
  return;
}

Assistant:

size_t size() const FMT_NOEXCEPT { return size_; }